

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLTools.h
# Opt level: O0

string * Assimp::XMLEscape(string *__return_storage_ptr__,string *data)

{
  char *pcVar1;
  char local_41;
  ulong uStack_40;
  char c;
  size_t i;
  ulong local_28;
  size_t size;
  string *local_18;
  string *data_local;
  string *buffer;
  
  size._7_1_ = 0;
  local_18 = data;
  data_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_28 = std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (uStack_40 = 0; uStack_40 < local_28; uStack_40 = uStack_40 + 1) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
    local_41 = *pcVar1;
    switch(local_41) {
    case '\"':
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    default:
      std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_41);
      break;
    case '&':
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    case '\'':
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    case '<':
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    case '>':
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XMLEscape(const std::string& data) {
        std::string buffer;

        const size_t size = data.size();
        buffer.reserve(size + size / 8);
        for(size_t i = 0; i < size; ++i) {
            const char c = data[i];
            switch(c) {
                case '&' :
                    buffer.append("&amp;");
                    break;
                case '\"':
                    buffer.append("&quot;");
                    break;
                case '\'':
                    buffer.append("&apos;");
                    break;
                case '<' :
                    buffer.append("&lt;");
                    break;
                case '>' :
                    buffer.append("&gt;");
                    break;
                default:
                    buffer.append(&c, 1);
                    break;
            }
        }
        return buffer;
    }